

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbiftio.cpp
# Opt level: O0

void CVmBifTIO::askfile(uint argc)

{
  bool bVar1;
  int iVar2;
  vm_obj_id_t vVar3;
  FILE *__stream;
  char *pcVar4;
  undefined8 *puVar5;
  long *plVar6;
  CVmObject *pCVar7;
  err_frame_t err_cur__;
  char *fname2;
  char *fnamep;
  char fullprompt [4501];
  osfildef *fp;
  int ok;
  unsigned_long attrs;
  int evt;
  int from_ui;
  char warning [4351];
  int from_script;
  vm_val_t val;
  CVmObjList *lst;
  vm_obj_id_t lst_obj;
  char fname [12289];
  int result;
  os_filetype_t file_type;
  int dialog_type;
  char prompt [256];
  ulong *element_count;
  undefined4 in_stack_ffffffffffffaaa0;
  int in_stack_ffffffffffffaaa4;
  undefined4 in_stack_ffffffffffffaaa8;
  undefined4 in_stack_ffffffffffffaaac;
  CCharmapToUni *in_stack_ffffffffffffaab0;
  CVmConsoleMain *pCVar8;
  int *in_stack_ffffffffffffaab8;
  CVmConsole *in_stack_ffffffffffffaac0;
  CVmConsole *in_stack_ffffffffffffaac8;
  undefined8 uVar9;
  int *in_stack_ffffffffffffaad0;
  CVmConsole *in_stack_ffffffffffffaad8;
  undefined8 in_stack_ffffffffffffaae0;
  undefined8 in_stack_ffffffffffffaae8;
  unsigned_long *in_stack_ffffffffffffaaf0;
  uint local_54f8 [2];
  undefined8 local_54f0;
  CVmConsole *local_54e8;
  char *local_5410;
  char local_5408 [12];
  int in_stack_ffffffffffffac04;
  char **in_stack_ffffffffffffac08;
  int in_stack_ffffffffffffac14;
  char *in_stack_ffffffffffffac18;
  int in_stack_ffffffffffffac24;
  CVmConsole *in_stack_ffffffffffffac28;
  int in_stack_ffffffffffffac40;
  int in_stack_ffffffffffffac48;
  int in_stack_ffffffffffffac50;
  ulong local_4258;
  int local_424c;
  char local_4248 [3];
  undefined1 auStack_4245 [4361];
  int local_313c;
  vm_val_t local_3138;
  CVmObject *local_3128;
  vm_obj_id_t local_311c;
  char local_3118 [12292];
  int local_114;
  int local_110;
  int local_10c;
  char local_108 [264];
  
  local_313c = 0;
  memset(local_4248,0,0x10ff);
  local_424c = 0;
  CVmBif::check_argc(0,0x2aed29);
  CVmBif::pop_str_val_ui
            ((char *)in_stack_ffffffffffffaab0,
             CONCAT44(in_stack_ffffffffffffaaac,in_stack_ffffffffffffaaa8));
  local_10c = CVmBif::pop_int_val();
  local_110 = CVmBif::pop_int_val();
  CVmBif::pop_long_val();
  element_count = &local_4258;
  iVar2 = CVmConsole::read_event_script
                    (in_stack_ffffffffffffaad8,in_stack_ffffffffffffaad0,
                     (char *)in_stack_ffffffffffffaac8,(size_t)in_stack_ffffffffffffaac0,
                     in_stack_ffffffffffffaab8,(int)((ulong)in_stack_ffffffffffffaab0 >> 0x20),
                     in_stack_ffffffffffffaaf0);
  if (iVar2 == 0) {
    if (G_net_config_X == (TadsNetConfig *)0x0) {
      iVar2 = (int)local_108;
      pCVar8 = G_console_X;
      strlen(local_108);
      element_count = (ulong *)CONCAT44((int)((ulong)element_count >> 0x20),local_110);
      in_stack_ffffffffffffaaa0 = 0;
      local_114 = CVmConsole::askfile(in_stack_ffffffffffffaac8,(char *)in_stack_ffffffffffffaac0,
                                      (size_t)in_stack_ffffffffffffaab8,
                                      (char *)in_stack_ffffffffffffaab0,
                                      CONCAT44(in_stack_ffffffffffffaaac,in_stack_ffffffffffffaaa8),
                                      in_stack_ffffffffffffaaa4,(os_filetype_t)pCVar8,iVar2);
      local_424c = 1;
    }
    else {
      pcVar4 = TadsNetConfig::get(G_net_config_X,"hostname");
      if (pcVar4 == (char *)0x0) {
        local_114 = osnet_askfile(local_108,local_3118,0x3001,local_10c,local_110);
      }
      else {
        local_114 = 1;
      }
    }
  }
  else {
    bVar1 = true;
    local_313c = 1;
    local_114 = 2;
    if (local_3118[0] != '\0') {
      local_114 = 0;
    }
    if ((((local_10c == 2) && (local_114 == 0)) && ((local_4258 & 1) == 0)) &&
       (iVar2 = CVmNetFile::exists((char *)CONCAT44(in_stack_ffffffffffffaaa4,
                                                    in_stack_ffffffffffffaaa0),
                                   (int)((ulong)element_count >> 0x20)), iVar2 != 0)) {
      bVar1 = false;
      t3sprintf(local_4248,0x10ff,"OV The script might overwrite the file %s. ",local_3118);
    }
    if (((bVar1) && (local_10c == 2)) &&
       ((local_114 == 0 &&
        (iVar2 = CVmNetFile::can_write
                           ((char *)CONCAT44(in_stack_ffffffffffffaaac,in_stack_ffffffffffffaaa8),
                            in_stack_ffffffffffffaaa4), iVar2 == 0)))) {
      __stream = fopen(local_3118,"wb");
      if (__stream == (FILE *)0x0) {
        bVar1 = false;
        t3sprintf(local_4248,0x10ff,
                  "WR The script is attempting to write file %s, but that file cannot be written.",
                  local_3118);
      }
      else {
        fclose(__stream);
        remove(local_3118);
      }
    }
    if (((bVar1) && (local_10c == 1)) &&
       ((local_114 == 0 &&
        (iVar2 = CVmNetFile::exists((char *)CONCAT44(in_stack_ffffffffffffaaa4,
                                                     in_stack_ffffffffffffaaa0),
                                    (int)((ulong)element_count >> 0x20)), iVar2 == 0)))) {
      bVar1 = false;
      t3sprintf(local_4248,0x10ff,
                "RD The script is attempting to open file %s, but this file doesn\'t exist or isn\'t readable."
                ,local_3118);
    }
    if ((!bVar1) && (G_net_config_X == (TadsNetConfig *)0x0)) {
      t3sprintf(local_5408,0x1195,
                "%s Do you wish to proceed? Select Yes to proceed with this file, No to choose a different file, or Cancel to stop replaying this script."
                ,auStack_4245);
      do {
        in_stack_ffffffffffffaaa8 = 1;
        in_stack_ffffffffffffaaa0 = 3;
        element_count = (ulong *)CONCAT44((int)((ulong)element_count >> 0x20),2);
        iVar2 = CVmConsole::input_dialog
                          (in_stack_ffffffffffffac28,in_stack_ffffffffffffac24,
                           in_stack_ffffffffffffac18,in_stack_ffffffffffffac14,
                           in_stack_ffffffffffffac08,in_stack_ffffffffffffac04,
                           in_stack_ffffffffffffac40,in_stack_ffffffffffffac48,
                           in_stack_ffffffffffffac50);
        if (iVar2 == 1) goto LAB_002af0ad;
        if (iVar2 != 2) {
          if (iVar2 == 3) {
            close_script_file();
            local_114 = 2;
          }
          goto LAB_002af0ad;
        }
        strlen(local_108);
        element_count = (ulong *)CONCAT44((int)((ulong)element_count >> 0x20),local_110);
        in_stack_ffffffffffffaaa0 = 1;
        local_114 = CVmConsole::askfile(in_stack_ffffffffffffaac8,(char *)in_stack_ffffffffffffaac0,
                                        (size_t)in_stack_ffffffffffffaab8,
                                        (char *)in_stack_ffffffffffffaab0,
                                        CONCAT44(in_stack_ffffffffffffaaac,in_stack_ffffffffffffaaa8
                                                ),in_stack_ffffffffffffaaa4,
                                        (os_filetype_t)in_stack_ffffffffffffaae0,
                                        (int)in_stack_ffffffffffffaae8);
        local_313c = 0;
      } while (local_114 == 2);
      if (local_114 == 1) {
        close_script_file();
      }
LAB_002af0ad:
      local_4248[0] = '\0';
    }
  }
  local_311c = CVmObjList::create(in_stack_ffffffffffffaaa4,(size_t)element_count);
  local_3128 = vm_objp(0);
  CVmObjList::cons_clear
            ((CVmObjList *)CONCAT44(in_stack_ffffffffffffaaa4,in_stack_ffffffffffffaaa0));
  vm_val_t::set_obj(&local_3138,local_311c);
  CVmStack::push(&local_3138);
  vm_val_t::set_int(&local_3138,local_114);
  CVmObjList::cons_set_element
            ((CVmObjList *)CONCAT44(in_stack_ffffffffffffaaa4,in_stack_ffffffffffffaaa0),
             (size_t)element_count,(vm_val_t *)0x2af233);
  if (local_114 == 0) {
    local_5410 = local_3118;
    puVar5 = (undefined8 *)_ZTW11G_err_frame();
    local_54f0 = *puVar5;
    plVar6 = (long *)_ZTW11G_err_frame();
    *plVar6 = (long)local_54f8;
    local_54f8[0] = _setjmp((__jmp_buf_tag *)&stack0xffffffffffffab20);
    if (local_54f8[0] == 0) {
      if (local_313c != 0) {
        CCharmapToUni::map_str_alo
                  (in_stack_ffffffffffffaab0,
                   (char **)CONCAT44(in_stack_ffffffffffffaaac,in_stack_ffffffffffffaaa8),
                   (char *)CONCAT44(in_stack_ffffffffffffaaa4,in_stack_ffffffffffffaaa0));
        local_5410 = (char *)0x0;
      }
      strlen(local_5410);
      vVar3 = CVmObjFileName::create_from_local
                        ((char *)CONCAT44(in_stack_ffffffffffffaaa4,in_stack_ffffffffffffaaa0),
                         (size_t)element_count);
      vm_val_t::set_obj(&local_3138,vVar3);
      if (local_424c != 0) {
        if (local_3138.val.obj != 0) {
          pCVar7 = vm_objp(0);
          iVar2 = (*pCVar7->_vptr_CVmObject[1])(pCVar7,CVmObjFileName::metaclass_reg_);
          if (iVar2 != 0) {
            vm_objp(0);
          }
        }
        CVmObjFileName::set_from_ui
                  ((CVmObjFileName *)CONCAT44(in_stack_ffffffffffffaaa4,in_stack_ffffffffffffaaa0),
                   (int)((ulong)element_count >> 0x20));
      }
    }
    if ((local_54f8[0] & 0x8000) == 0) {
      local_54f8[0] = local_54f8[0] | 0x8000;
      lib_free_str((char *)0x2af390);
    }
    uVar9 = local_54f0;
    puVar5 = (undefined8 *)_ZTW11G_err_frame();
    *puVar5 = uVar9;
    if ((local_54f8[0] & 0x4001) != 0) {
      puVar5 = (undefined8 *)_ZTW11G_err_frame();
      if ((*(uint *)*puVar5 & 2) != 0) {
        plVar6 = (long *)_ZTW11G_err_frame();
        free(*(void **)(*plVar6 + 0x10));
      }
      in_stack_ffffffffffffaac0 = local_54e8;
      plVar6 = (long *)_ZTW11G_err_frame();
      *(CVmConsole **)(*plVar6 + 0x10) = in_stack_ffffffffffffaac0;
      err_rethrow();
    }
    if ((local_54f8[0] & 2) != 0) {
      free(local_54e8);
    }
    CVmObjList::cons_set_element
              ((CVmObjList *)CONCAT44(in_stack_ffffffffffffaaa4,in_stack_ffffffffffffaaa0),
               (size_t)element_count,(vm_val_t *)0x2af42e);
    vm_val_t::set_nil(&local_3138);
    CVmObjList::cons_set_element
              ((CVmObjList *)CONCAT44(in_stack_ffffffffffffaaa4,in_stack_ffffffffffffaaa0),
               (size_t)element_count,(vm_val_t *)0x2af455);
    if (local_4248[0] == '\0') {
      vm_val_t::set_nil(&local_3138);
    }
    else {
      vVar3 = CVmBif::str_from_ui_str
                        ((char *)CONCAT44(in_stack_ffffffffffffaaa4,in_stack_ffffffffffffaaa0));
      vm_val_t::set_obj(&local_3138,vVar3);
    }
    CVmObjList::cons_set_element
              ((CVmObjList *)CONCAT44(in_stack_ffffffffffffaaa4,in_stack_ffffffffffffaaa0),
               (size_t)element_count,(vm_val_t *)0x2af4a7);
  }
  if (local_114 == 0) {
    iVar2 = (int)((ulong)local_3118 >> 0x20);
    pCVar8 = G_console_X;
    strlen(local_3118);
    CVmConsole::log_event
              (in_stack_ffffffffffffaac0,iVar2,(char *)pCVar8,
               CONCAT44(in_stack_ffffffffffffaaac,in_stack_ffffffffffffaaa8),
               in_stack_ffffffffffffaaa4);
  }
  else {
    CVmConsole::log_event
              ((CVmConsole *)CONCAT44(in_stack_ffffffffffffaaa4,in_stack_ffffffffffffaaa0),
               (int)((ulong)element_count >> 0x20));
  }
  CVmBif::retval_obj(0);
  CVmStack::discard();
  return;
}

Assistant:

void CVmBifTIO::askfile(VMG_ uint argc)
{
    char prompt[256];
    int dialog_type;
    os_filetype_t file_type;
    int result;
    char fname[OSFNMAX*3 + 1];
    vm_obj_id_t lst_obj;
    CVmObjList *lst;
    vm_val_t val;
    int from_script = FALSE;
    char warning[OSFNMAX + 255] = "";
    int from_ui = FALSE;
    
    /* check arguments */
    check_argc(vmg_ argc, 4);

    /* get the prompt string */
    pop_str_val_ui(vmg_ prompt, sizeof(prompt));

    /* get the dialog type and file type */
    dialog_type = pop_int_val(vmg0_);
    file_type = (os_filetype_t)pop_int_val(vmg0_);

    /* 
     *   Pop and discard the flags.  (This argument isn't used currently;
     *   it's just there in case we need some option flags in the future.
     *   Pop it as an integer to ensure the caller specified the correct
     *   type, but discard the value.)
     */
    (void)pop_long_val(vmg0_);

    /* check for a script response */
    static int filter[] = { VMCON_EVT_FILE };
    int evt;
    unsigned long attrs;
    if (G_console->read_event_script(
        vmg_ &evt, fname, sizeof(fname), filter, countof(filter), &attrs))
    {
        int ok = TRUE;
        
        /* we got a response from the script */
        from_script = TRUE;
        result = (fname[0] != '\0' ? OS_AFE_SUCCESS : OS_AFE_CANCEL);

        /* 
         *   If this is a "save" prompt, and the OVERWRITE flag isn't set,
         *   and the file already exists, show an interactive warning that
         *   we're about to ovewrite the file.  
         */
        if (ok
            && dialog_type == OS_AFP_SAVE
            && result == OS_AFE_SUCCESS
            && (attrs & VMCON_EVTATTR_OVERWRITE) == 0
            && CVmNetFile::exists(vmg_ fname, 0))
        {
            /* the file exists - warn about the overwrite */
            ok = FALSE;
            t3sprintf(warning, sizeof(warning),
                      "OV The script might overwrite the file %s. ", fname);
        }

        /* 
         *   If this is a "save" prompt, check to see if we can write the
         *   file, and warn if not.
         */
        if (ok
            && dialog_type == OS_AFP_SAVE
            && result == OS_AFE_SUCCESS
            && !CVmNetFile::can_write(vmg_ fname, 0))
        {
            /* try creating the file */
            osfildef *fp = osfopwb(fname, file_type);

            /* if that succeeded, undo the creation; otherwise warn */
            if (fp != 0)
            {
                /* it worked - close and delete the test file */
                osfcls(fp);
                osfdel(fname);
            }
            else
            {
                /* didn't work - warn about it */
                ok = FALSE;
                t3sprintf(warning, sizeof(warning),
                          "WR The script is attempting to write file %s, "
                          "but that file cannot be written.", fname);
            }
        }

        /*
         *   If this is an "open" prompt, and the file isn't readable, warn
         *   about it.  
         */
        if (ok
            && dialog_type == OS_AFP_OPEN
            && result == OS_AFE_SUCCESS
            && !CVmNetFile::exists(vmg_ fname, 0))
        {
            ok = FALSE;
            t3sprintf(warning, sizeof(warning),
                      "RD The script is attempting to open file %s, "
                      "but this file doesn't exist or isn't readable.",
                      fname);
        }

        /* 
         *   If we generated a warning, and we're not in Web UI mode, display
         *   the warning as a Yes/No/Cancel console input dialog.  We can't
         *   do this in Web UI mode, since we can't use the regular console
         *   in Web mode.  Instead, we'll return the warning information to
         *   the caller for display.  
         */
        if (!ok && G_net_config == 0)
        {
            char fullprompt[OSFNMAX + 255 + 150];

            /* build the full prompt */
            t3sprintf(fullprompt, sizeof(fullprompt),
                      "%s Do you wish to proceed? Select Yes to "
                      "proceed with this file, No to choose a different "
                      "file, or Cancel to stop replaying this script.",
                      warning + 3);

            /* 
             *   display a dialog - note that this goes directly to user,
             *   bypassing the active script, since this is a question about
             *   how to handle a problem in the script 
             */
        show_warning:
            switch (G_console->input_dialog(
                vmg_ OS_INDLG_ICON_WARNING, fullprompt,
                OS_INDLG_YESNOCANCEL, 0, 0, 2, 3, TRUE))
            {
            case 1:
                /* yes - proceed with fname */
                break;

            case 2:
                /* no - ask for a new file */
                result = G_console->askfile(
                    vmg_ prompt, strlen(prompt),
                    fname, sizeof(fname), dialog_type, file_type, TRUE);

                /* this didn't come from the script after all */
                from_script = FALSE;

                /* 
                 *   If they canceled the file selection, go back to the
                 *   warning dialog; if the dialog itself failed, cancel the
                 *   script entirely.  If they selected a file, proceed with
                 *   their new file replacing the script input.  Note that we
                 *   don't have to repeat the tests above on the new file,
                 *   since the user explicitly entered it and thus presumably
                 *   knows that it's the one they really want to use.  
                 */
                if (result == OS_AFE_CANCEL)
                    goto show_warning;
                else if (result == OS_AFE_FAILURE)
                    close_script_file(vmg0_);

                /* handled */
                break;

            case 3:
                /* cancel - stop the script playback */
                close_script_file(vmg0_);

                /* indicate cancellation */
                result = OS_AFE_CANCEL;
                break;
            }

            /* we've displayed the warning, so don't return it */
            warning[0] = '\0';
        }
    }
    else if (G_net_config != 0)
    {
#ifdef TADSNET
        /*
         *   If we're running in the local stand-alone configuration, we have
         *   a bit of a special case: we're accessing files on the local file
         *   system, but we're presenting the rest of the program's UI
         *   through a browser window, which might be in a separate child
         *   process; we have to present the file dialog UI in the same
         *   manner.  We have a special OS function for this situation.
         *   
         *   This only applies in the stand-alone configuration, where we
         *   have no "hostname" parameter in the net config.  If we have a
         *   hostname, it means that we're operating in full client/server
         *   mode, in which case we go through the Web UI directly.  
         */
        if (G_net_config->get("hostname") == 0)
        {
            result = osnet_askfile(prompt, fname, sizeof(fname),
                                   dialog_type, file_type);
        }
        else
#endif
        {
            /* there's no console in web host mode - return eof */
            result = OS_AFE_FAILURE;
        }
    }
    else
    {
        /* ask for a file via the console UI */
        result = G_console->askfile(
            vmg_ prompt, strlen(prompt),
            fname, sizeof(fname), dialog_type, file_type);

        /* this file came from the console UI */
        from_ui = TRUE;
    }